

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::RunCommand(cmCTest *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *stdOut,string *stdErr,int *retVal,char *dir,cmDuration timeout,
                   Encoding encoding)

{
  undefined1 *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  cmsysProcess *cp_00;
  char **command;
  pointer pPVar4;
  ulong uVar5;
  char *pcVar6;
  ostream *poVar7;
  char *pcVar8;
  rep_conflict timeout_00;
  string local_640 [32];
  undefined1 local_620 [8];
  ostringstream cmCTestLog_msg_2;
  char *error_str_1;
  undefined1 local_480 [8];
  ostringstream cmCTestLog_msg_1;
  char *error_str;
  undefined1 local_2e0 [8];
  ostringstream cmCTestLog_msg;
  char *exception_str;
  undefined1 local_158 [7];
  bool result;
  vector<char,_std::allocator<char>_> local_140;
  string local_128;
  byte local_105;
  int local_104;
  undefined1 local_100 [3];
  bool done;
  int res;
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_d8;
  int length;
  char *data;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  cmsysProcess *cp;
  value_type local_90;
  reference local_88;
  string *a;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_58 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  char *dir_local;
  int *retVal_local;
  string *stdErr_local;
  string *stdOut_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTest *this_local;
  cmDuration timeout_local;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dir;
  this_local = (cmCTest *)timeout.__r;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,sVar3 + 1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(args);
  a = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(args);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&a), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    local_90 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,&local_90);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cp = (cmsysProcess *)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,(value_type *)&cp);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  cp_00 = cmsysProcess_New();
  command = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  cmsysProcess_SetCommand(cp_00,command);
  cmsysProcess_SetWorkingDirectory
            (cp_00,(char *)argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = cmSystemTools::GetRunCommandHideConsole();
  if (bVar1) {
    cmsysProcess_SetOption(cp_00,0,1);
  }
  timeout_00 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                         ((duration<double,_std::ratio<1L,_1L>_> *)&this_local);
  cmsysProcess_SetTimeout(cp_00,timeout_00);
  cmsysProcess_Execute(cp_00);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&data);
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
  std::__cxx11::string::string((string *)local_100);
  local_105 = 0;
  while (((local_105 ^ 0xff) & 1) != 0) {
    local_104 = cmsysProcess_WaitForData
                          (cp_00,&stack0xffffffffffffff28,
                           (int *)(strdata.field_2._M_local_buf + 0xc),(double *)0x0);
    if (local_104 == 2) {
      ::cm::append<std::vector<char,_std::allocator<char>_>,_char_*,_0>
                ((vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 pcStack_d8,pcStack_d8 + (int)strdata.field_2._12_4_);
    }
    else if (local_104 == 3) {
      ::cm::append<std::vector<char,_std::allocator<char>_>,_char_*,_0>
                ((vector<char,_std::allocator<char>_> *)&data,pcStack_d8,
                 pcStack_d8 + (int)strdata.field_2._12_4_);
    }
    else {
      local_105 = 1;
    }
    if (((local_104 == 2) || (local_104 == 3)) &&
       (pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl), (pPVar4->ExtraVerbose & 1U) != 0)) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_d8,
                 (long)(int)strdata.field_2._12_4_,(string *)local_100,0);
      cmSystemTools::Stdout((string *)local_100);
    }
  }
  pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar4->ExtraVerbose & 1U) != 0) {
    std::__cxx11::string::string((string *)&local_128);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_128,
               (string *)local_100,0);
    std::__cxx11::string::~string((string *)&local_128);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmSystemTools::Stdout((string *)local_100);
    }
  }
  cmsysProcess_WaitForExit(cp_00,(double *)0x0);
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)
                     &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  if (!bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_140,
               (vector<char,_std::allocator<char>_> *)
               &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_140,
               (vector<char,_std::allocator<char>_> *)
               &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,0);
    std::vector<char,_std::allocator<char>_>::~vector(&local_140);
    this_00 = &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    pcVar6 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)this_00);
    std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)this_00);
    std::__cxx11::string::append((char *)stdOut,(ulong)pcVar6);
  }
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)&data);
  if (!bVar1) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_158,
               (vector<char,_std::allocator<char>_> *)&data);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),
               (vector<char,_std::allocator<char>_> *)local_158,
               (vector<char,_std::allocator<char>_> *)&data,0);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_158);
    pcVar6 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)&data);
    std::vector<char,_std::allocator<char>_>::size((vector<char,_std::allocator<char>_> *)&data);
    std::__cxx11::string::append((char *)stdErr,(ulong)pcVar6);
  }
  exception_str._7_1_ = true;
  iVar2 = cmsysProcess_GetState(cp_00);
  if (iVar2 == 4) {
    if (retVal == (int *)0x0) {
      iVar2 = cmsysProcess_GetExitValue(cp_00);
      exception_str._7_1_ = iVar2 == 0;
    }
    else {
      iVar2 = cmsysProcess_GetExitValue(cp_00);
      *retVal = iVar2;
    }
  }
  else {
    iVar2 = cmsysProcess_GetState(cp_00);
    if (iVar2 == 2) {
      pcVar6 = cmsysProcess_GetExceptionString(cp_00);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
      poVar7 = std::operator<<((ostream *)local_2e0,pcVar6);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xdbb,pcVar8,false);
      std::__cxx11::string::~string((string *)&error_str);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
      strlen(pcVar6);
      std::__cxx11::string::append((char *)stdErr,(ulong)pcVar6);
      exception_str._7_1_ = false;
    }
    else {
      iVar2 = cmsysProcess_GetState(cp_00);
      if (iVar2 == 1) {
        pcVar6 = cmsysProcess_GetErrorString(cp_00);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_480);
        poVar7 = std::operator<<((ostream *)local_480,pcVar6);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xdc0,pcVar8,false);
        std::__cxx11::string::~string((string *)&error_str_1);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_480);
        strlen(pcVar6);
        std::__cxx11::string::append((char *)stdErr,(ulong)pcVar6);
        exception_str._7_1_ = false;
      }
      else {
        iVar2 = cmsysProcess_GetState(cp_00);
        if (iVar2 == 5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_620);
          poVar7 = std::operator<<((ostream *)local_620,"Process terminated due to timeout\n");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          Log(this,7,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0xdc5,pcVar6,false);
          std::__cxx11::string::~string(local_640);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_620);
          strlen("Process terminated due to timeout\n");
          std::__cxx11::string::append((char *)stdErr,0xd12222);
        }
        exception_str._7_1_ = iVar2 != 5;
      }
    }
  }
  cmsysProcess_Delete(cp_00);
  std::__cxx11::string::~string((string *)local_100);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&data);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  return exception_str._7_1_;
}

Assistant:

bool cmCTest::RunCommand(std::vector<std::string> const& args,
                         std::string* stdOut, std::string* stdErr, int* retVal,
                         const char* dir, cmDuration timeout,
                         Encoding encoding)
{
  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  stdOut->clear();
  stdErr->clear();

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }
  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  std::vector<char> tempOutput;
  std::vector<char> tempError;
  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  int res;
  bool done = false;
  while (!done) {
    res = cmsysProcess_WaitForData(cp, &data, &length, nullptr);
    switch (res) {
      case cmsysProcess_Pipe_STDOUT:
        cm::append(tempOutput, data, data + length);
        break;
      case cmsysProcess_Pipe_STDERR:
        cm::append(tempError, data, data + length);
        break;
      default:
        done = true;
    }
    if ((res == cmsysProcess_Pipe_STDOUT || res == cmsysProcess_Pipe_STDERR) &&
        this->Impl->ExtraVerbose) {
      processOutput.DecodeText(data, length, strdata);
      cmSystemTools::Stdout(strdata);
    }
  }
  if (this->Impl->ExtraVerbose) {
    processOutput.DecodeText(std::string(), strdata);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  if (!tempOutput.empty()) {
    processOutput.DecodeText(tempOutput, tempOutput);
    stdOut->append(tempOutput.data(), tempOutput.size());
  }
  if (!tempError.empty()) {
    processOutput.DecodeText(tempError, tempError);
    stdErr->append(tempError.data(), tempError.size());
  }

  bool result = true;
  if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
    } else {
      if (cmsysProcess_GetExitValue(cp) != 0) {
        result = false;
      }
    }
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Exception) {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    cmCTestLog(this, ERROR_MESSAGE, exception_str << std::endl);
    stdErr->append(exception_str, strlen(exception_str));
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Error) {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  } else if (cmsysProcess_GetState(cp) == cmsysProcess_State_Expired) {
    const char* error_str = "Process terminated due to timeout\n";
    cmCTestLog(this, ERROR_MESSAGE, error_str << std::endl);
    stdErr->append(error_str, strlen(error_str));
    result = false;
  }

  cmsysProcess_Delete(cp);
  return result;
}